

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O1

bool __thiscall
gguf_reader::read<unsigned_long>
          (gguf_reader *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *dst,size_t n)

{
  pointer puVar1;
  size_t sVar2;
  void *__ptr;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(dst,n);
  puVar1 = (dst->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar5 = (dst->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish == puVar1;
  if (!bVar5) {
    lVar4 = 8;
    sVar2 = fread(puVar1,1,8,(FILE *)this->file);
    if (sVar2 == 8) {
      uVar3 = 0;
      do {
        uVar3 = uVar3 + 1;
        puVar1 = (dst->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        bVar5 = (ulong)((long)(dst->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <=
                uVar3;
        if (bVar5) {
          return bVar5;
        }
        __ptr = (void *)((long)puVar1 + lVar4);
        lVar4 = lVar4 + 8;
        sVar2 = fread(__ptr,1,8,(FILE *)this->file);
      } while (sVar2 == 8);
    }
  }
  return bVar5;
}

Assistant:

bool read(std::vector<T> & dst, const size_t n) const {
        dst.resize(n);
        for (size_t i = 0; i < dst.size(); ++i) {
            if constexpr (std::is_same<T, bool>::value) {
                bool tmp;
                if (!read(tmp)) {
                    return false;
                }
                dst[i] = tmp;
            } else {
                if (!read(dst[i])) {
                    return false;
                }
            }
        }
        return true;
    }